

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O0

void do_cmd_wiz_query_feature(command_conflict *cmd)

{
  _Bool _Var1;
  wchar_t wVar2;
  char local_7d;
  wchar_t local_7c;
  wchar_t wStack_78;
  char choice;
  wchar_t feata [1];
  wchar_t featr [1];
  wchar_t featp [1];
  wchar_t featg [1];
  wchar_t featq [2];
  wchar_t featm [2];
  wchar_t feath [1];
  wchar_t featd [4];
  wchar_t featc [1];
  wchar_t featt [2];
  wchar_t featz [1];
  wchar_t featu [1];
  wchar_t featb [1];
  wchar_t feato [1];
  wchar_t featf [1];
  wiz_query_feature_closure selected;
  wchar_t feature_class;
  command_conflict *cmd_local;
  
  featb[0] = FEAT_FLOOR;
  featu[0] = FEAT_OPEN;
  featz[0] = FEAT_BROKEN;
  featt[1] = FEAT_LESS;
  featt[0] = FEAT_MORE;
  featd[3] = FEAT_LESS;
  featd[2] = FEAT_CLOSED;
  featm[1] = FEAT_CLOSED;
  featd[0] = FEAT_BROKEN;
  featd[1] = FEAT_SECRET;
  featm[0] = FEAT_SECRET;
  featq[0] = FEAT_MAGMA;
  featq[1] = FEAT_MAGMA_K;
  featp[0] = FEAT_QUARTZ;
  featr[0] = FEAT_GRANITE;
  feata[0] = FEAT_PERM;
  wStack_78 = FEAT_RUBBLE;
  local_7c = FEAT_PASS_RUBBLE;
  wVar2 = cmd_get_arg_choice((command *)cmd,"choice",(int *)&selected.field_0xc);
  if (wVar2 != L'\0') {
    _Var1 = get_com("Debug Command Feature Query: ",&local_7d);
    if (!_Var1) {
      return;
    }
    selected._12_4_ = SEXT14(local_7d);
    cmd_set_arg_choice((command *)cmd,"choice",selected._12_4_);
  }
  switch(selected._12_4_) {
  case (BADTYPE)0x61:
    _feato = &local_7c;
    selected.features._0_4_ = 1;
    break;
  case (BADTYPE)0x62:
    _feato = featz;
    selected.features._0_4_ = 1;
    break;
  case (BADTYPE)0x63:
    _feato = featd + 2;
    selected.features._0_4_ = 1;
    break;
  case (BADTYPE)0x64:
    _feato = featm + 1;
    selected.features._0_4_ = 4;
    break;
  default:
    msg("That was an invalid selection.  Use one of fobuztcdhmqgpra .");
    return;
  case (BADTYPE)0x66:
    _feato = featb;
    selected.features._0_4_ = 1;
    break;
  case (BADTYPE)0x67:
    _feato = featr;
    selected.features._0_4_ = 1;
    break;
  case (BADTYPE)0x68:
    _feato = featm;
    selected.features._0_4_ = 1;
    break;
  case (BADTYPE)0x6d:
    _feato = featq;
    selected.features._0_4_ = 2;
    break;
  case (BADTYPE)0x6f:
    _feato = featu;
    selected.features._0_4_ = 1;
    break;
  case (BADTYPE)0x70:
    _feato = feata;
    selected.features._0_4_ = 1;
    break;
  case (BADTYPE)0x71:
    _feato = featp;
    selected.features._0_4_ = 2;
    break;
  case (BADTYPE)0x72:
    _feato = &stack0xffffffffffffff88;
    selected.features._0_4_ = 1;
    break;
  case (BADTYPE)0x74:
    _feato = featd + 3;
    selected.features._0_4_ = 2;
    break;
  case (BADTYPE)0x75:
    _feato = featt + 1;
    selected.features._0_4_ = 1;
    break;
  case (BADTYPE)0x7a:
    _feato = featt;
    selected.features._0_4_ = 1;
  }
  wiz_hack_map((chunk *)cave,player,wiz_hack_map_query_feature,feato);
  Term_redraw();
  msg("Press any key.");
  inkey_ex();
  prt("",L'\0',L'\0');
  prt_map();
  return;
}

Assistant:

void do_cmd_wiz_query_feature(struct command *cmd)
{
	int feature_class;
	struct wiz_query_feature_closure selected;
	/* OMG hax */
	const int featf[] = { FEAT_FLOOR };
	const int feato[] = { FEAT_OPEN };
	const int featb[] = { FEAT_BROKEN };
	const int featu[] = { FEAT_LESS };
	const int featz[] = { FEAT_MORE };
	const int featt[] = { FEAT_LESS, FEAT_MORE };
	const int featc[] = { FEAT_CLOSED };
	const int featd[] = { FEAT_CLOSED, FEAT_OPEN, FEAT_BROKEN,
		FEAT_SECRET };
	const int feath[] = { FEAT_SECRET };
	const int featm[] = { FEAT_MAGMA, FEAT_MAGMA_K };
	const int featq[] = { FEAT_QUARTZ, FEAT_QUARTZ_K };
	const int featg[] = { FEAT_GRANITE };
	const int featp[] = { FEAT_PERM };
	const int featr[] = { FEAT_RUBBLE };
	const int feata[] = { FEAT_PASS_RUBBLE };

	if (cmd_get_arg_choice(cmd, "choice", &feature_class) != CMD_OK) {
		char choice;

		if (!get_com("Debug Command Feature Query: ", &choice)) return;
		feature_class = choice;
		cmd_set_arg_choice(cmd, "choice", feature_class);
	}

	switch (feature_class) {
		/* Floors */
		case 'f':
			selected.features = featf;
			selected.n = (int) N_ELEMENTS(featf);
			break;

		/* Open doors */
		case 'o':
			selected.features = feato;
			selected.n = (int) N_ELEMENTS(feato);
			break;

		/* Broken doors */
		case 'b':
			selected.features = featb;
			selected.n = (int) N_ELEMENTS(featb);
			break;

		/* Upstairs */
		case 'u':
			selected.features = featu;
			selected.n = (int) N_ELEMENTS(featu);
			break;

		/* Downstairs */
		case 'z':
			selected.features = featz;
			selected.n = (int) N_ELEMENTS(featz);
			break;

		/* Stairs */
		case 't':
			selected.features = featt;
			selected.n = (int) N_ELEMENTS(featt);
			break;

		/* Closed doors */
		case 'c':
			selected.features = featc;
			selected.n = (int) N_ELEMENTS(featc);
			break;

		/* Doors */
		case 'd':
			selected.features = featd;
			selected.n = (int) N_ELEMENTS(featd);
			break;

		/* Secret doors */
		case 'h':
			selected.features = feath;
			selected.n = (int) N_ELEMENTS(feath);
			break;

		/* Magma */
		case 'm':
			selected.features = featm;
			selected.n = (int) N_ELEMENTS(featm);
			break;

		/* Quartz */
		case 'q':
			selected.features = featq;
			selected.n = (int) N_ELEMENTS(featq);
			break;

		/* Granite */
		case 'g':
			selected.features = featg;
			selected.n = (int) N_ELEMENTS(featg);
			break;

		/* Permanent wall */
		case 'p':
			selected.features = featp;
			selected.n = (int) N_ELEMENTS(featp);
			break;

		/* Rubble */
		case 'r':
			selected.features = featr;
			selected.n = (int) N_ELEMENTS(featr);
			break;

		/* Passable rubble */
		case 'a':
			selected.features = feata;
			selected.n = (int) N_ELEMENTS(feata);
			break;

		/* Invalid entry */
		default:
			msg("That was an invalid selection.  Use one of fobuztcdhmqgpra .");
			return;
	}

	wiz_hack_map(cave, player, wiz_hack_map_query_feature, &selected);

	Term_redraw();

	msg("Press any key.");
	inkey_ex();
	prt("", 0, 0);

	/* Redraw map */
	prt_map();
}